

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O1

void kmp_set_library(int arg)

{
  kmp_info_t *pkVar1;
  int iVar2;
  kmp_msg_t kStack_40;
  kmp_msg_t kStack_28;
  
  iVar2 = __kmp_get_global_thread_id_reg();
  pkVar1 = __kmp_threads[iVar2];
  if ((((pkVar1->th).th_root)->r).r_in_parallel == 0) {
    if ((arg == 3) || (arg == 2)) {
      (pkVar1->th).th_set_nproc = 0;
      iVar2 = __kmp_dflt_team_nth;
      if (__kmp_dflt_team_nth == 0) {
        iVar2 = __kmp_dflt_team_nth_ub;
      }
      (((pkVar1->th).th_current_task)->td_icvs).nproc = iVar2;
    }
    else if (arg == 1) {
      (pkVar1->th).th_set_nproc = 0;
      (((pkVar1->th).th_current_task)->td_icvs).nproc = 1;
    }
    else {
      __kmp_msg_format(&kStack_40,kmp_i18n_msg_UnknownLibraryType,arg);
      __kmp_msg(kmp_ms_fatal);
    }
    __kmp_aux_set_library(arg);
  }
  else {
    __kmp_msg_format(&kStack_28,kmp_i18n_msg_SetLibraryIncorrectCall);
    __kmp_msg(kmp_ms_warning);
  }
  return;
}

Assistant:

void FTN_STDCALL
FTN_SET_LIBRARY( int KMP_DEREF arg )
{
    #ifdef KMP_STUB
        __kmps_set_library( KMP_DEREF arg );
    #else
        enum library_type lib;
        lib = (enum library_type) KMP_DEREF arg;
        // __kmp_user_set_library initializes the library if needed
        __kmp_user_set_library( lib );
    #endif
}